

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# engine.cpp
# Opt level: O0

void __thiscall ocl::OpenCLEngine::trackEvent(OpenCLEngine *this,cl_event ev,string *message)

{
  cl_int cVar1;
  cl_command_queue command_queue;
  ocl_exception *this_00;
  string local_140 [2];
  undefined1 local_f9;
  string local_f8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_d8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_b8;
  string local_98;
  string local_78;
  string local_58;
  int local_28 [2];
  cl_int result;
  cl_int ciErrNum;
  string *message_local;
  cl_event ev_local;
  OpenCLEngine *this_local;
  
  local_28[1] = 0;
  local_28[0] = 0;
  _result = message;
  message_local = (string *)ev;
  ev_local = (cl_event)this;
  command_queue = queue(this);
  cVar1 = clFlush(command_queue);
  std::__cxx11::string::string((string *)&local_58,(string *)message);
  reportError(cVar1,0x16d,&local_58);
  std::__cxx11::string::~string((string *)&local_58);
  cVar1 = clWaitForEvents(1,(cl_event *)&message_local);
  std::__cxx11::string::string((string *)&local_78,(string *)message);
  reportError(cVar1,0x16e,&local_78);
  std::__cxx11::string::~string((string *)&local_78);
  cVar1 = clGetEventInfo((cl_event)message_local,0x11d3,4,local_28,(size_t *)0x0);
  std::__cxx11::string::string((string *)&local_98,(string *)message);
  reportError(cVar1,0x16f,&local_98);
  std::__cxx11::string::~string((string *)&local_98);
  if (local_28[0] != 0) {
    local_f9 = 1;
    this_00 = (ocl_exception *)__cxa_allocate_exception(0x10);
    to_string<int>(&local_f8,local_28[0]);
    std::operator+(&local_d8,
                   "Wait for event succeed, but it is still is not complete with execution status: "
                   ,&local_f8);
    std::operator+(&local_b8,&local_d8,"!");
    ocl_exception::ocl_exception(this_00,&local_b8);
    local_f9 = 0;
    __cxa_throw(this_00,&ocl_exception::typeinfo,ocl_exception::~ocl_exception);
  }
  cVar1 = clReleaseEvent((cl_event)message_local);
  std::__cxx11::string::string((string *)local_140,(string *)message);
  reportError(cVar1,0x179,local_140);
  std::__cxx11::string::~string((string *)local_140);
  return;
}

Assistant:

void OpenCLEngine::trackEvent(cl_event ev, std::string message)
{
	cl_int		ciErrNum	= CL_SUCCESS;
	cl_int		result		= CL_SUCCESS;

	try {
		OCL_SAFE_CALL_MESSAGE(clFlush(queue()), message);
		OCL_SAFE_CALL_MESSAGE(clWaitForEvents(1, &ev), message);
		OCL_SAFE_CALL_MESSAGE(clGetEventInfo(ev, CL_EVENT_COMMAND_EXECUTION_STATUS, sizeof(cl_int), &result, 0), message);

		if (result != CL_COMPLETE) {
			throw ocl_exception("Wait for event succeed, but it is still is not complete with execution status: " + to_string(result) + "!");
		}
	} catch (...) {
		OCL_SAFE_CALL_MESSAGE(clReleaseEvent(ev), message);
		throw;
	}

	OCL_SAFE_CALL_MESSAGE(clReleaseEvent(ev), message);
}